

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

bool __thiscall Hpipe::Cond::never_checked(Cond *this,Cond *not_in)

{
  bool bVar1;
  int local_28;
  int local_24;
  int i_1;
  int i;
  Cond *not_in_local;
  Cond *this_local;
  
  if (not_in == (Cond *)0x0) {
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_28);
      if (bVar1) {
        return false;
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
      bVar1 = std::bitset<256UL>::operator[](&not_in->p,(long)local_24);
      if ((!bVar1) && (bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_24), bVar1)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Cond::never_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and p[ i ] )
                return false;
    } else {
        for( int i = 0; i < p_size; ++i )
            if ( p[ i ] )
                return false;
    }
    return true;
}